

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::FuncType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
          *values,FuncType *out,char *desc)

{
  uint uVar1;
  pointer pFVar2;
  Result RVar3;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_a8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> vStack_90;
  Var local_78;
  
  Var::Var(&local_78,var);
  RVar3 = CheckIndex(this,&local_78,
                     (int)((ulong)((long)(values->
                                         super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(values->
                                        super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555,desc);
  Var::~Var(&local_78);
  if (out != (FuncType *)0x0) {
    if (RVar3.enum_ == Ok) {
      if (var->type_ != Index) {
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h"
                      ,0x38,"Index wabt::Var::index() const");
      }
      uVar1 = (var->field_2).index_;
      pFVar2 = (values->
               super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_a8,&pFVar2[uVar1].params);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&vStack_90,&pFVar2[uVar1].results);
    }
    else {
      vStack_90.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_90.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_90.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(&out->params,&local_a8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(&out->results,&vStack_90);
    if (vStack_90.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_90.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}